

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswCut.c
# Opt level: O2

int Csw_CutSupportMinimize(Csw_Man_t *p,Csw_Cut_t *pCut)

{
  uint uWord;
  int nVars;
  ulong uVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  uint *pTruth;
  
  pTruth = (uint *)((long)&pCut[1].pNext + (long)pCut->nLeafMax * 4);
  uWord = Kit_TruthSupport(pTruth,p->nLeafMax);
  nVars = Kit_WordCountOnes(uWord);
  if (nVars != pCut->nFanins) {
    if (pCut->nFanins <= nVars) {
      __assert_fail("nFansNew < pCut->nFanins",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/csw/cswCut.c"
                    ,0xc1,"int Csw_CutSupportMinimize(Csw_Man_t *, Csw_Cut_t *)");
    }
    Kit_TruthShrink(p->puTemp[0],pTruth,nVars,p->nLeafMax,uWord,1);
    bVar2 = pCut->nFanins;
    uVar1 = 0;
    if ((char)bVar2 < '\x01') {
      bVar2 = 0;
    }
    iVar3 = 0;
    for (; bVar2 != uVar1; uVar1 = uVar1 + 1) {
      if ((uWord >> ((uint)uVar1 & 0x1f) & 1) != 0) {
        lVar4 = (long)iVar3;
        iVar3 = iVar3 + 1;
        *(undefined4 *)((long)&pCut[1].pNext + lVar4 * 4) =
             *(undefined4 *)((long)&pCut[1].pNext + uVar1 * 4);
      }
    }
    if (iVar3 != nVars) {
      __assert_fail("k == nFansNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/csw/cswCut.c"
                    ,199,"int Csw_CutSupportMinimize(Csw_Man_t *, Csw_Cut_t *)");
    }
    pCut->nFanins = (char)nVars;
  }
  return nVars;
}

Assistant:

int Csw_CutSupportMinimize( Csw_Man_t * p, Csw_Cut_t * pCut )
{
    unsigned * pTruth;
    int uSupp, nFansNew, i, k;
    // get truth table
    pTruth = Csw_CutTruth( pCut );
    // get support 
    uSupp = Kit_TruthSupport( pTruth, p->nLeafMax );
    // get the new support size
    nFansNew = Kit_WordCountOnes( uSupp );
    // check if there are redundant variables
    if ( nFansNew == pCut->nFanins )
        return nFansNew;
    assert( nFansNew < pCut->nFanins );
    // minimize support
    Kit_TruthShrink( p->puTemp[0], pTruth, nFansNew, p->nLeafMax, uSupp, 1 );
    for ( i = k = 0; i < pCut->nFanins; i++ )
        if ( uSupp & (1 << i) )
            pCut->pFanins[k++] = pCut->pFanins[i];
    assert( k == nFansNew );
    pCut->nFanins = nFansNew;
//    assert( nFansNew == Kit_TruthSupportSize( pTruth, p->nLeafMax ) );
//Extra_PrintBinary( stdout, pTruth, (1<<p->nLeafMax) ); printf( "\n" );
    return nFansNew;
}